

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
          (UniformCollection *this)

{
  size_type sVar1;
  vector<glu::DataType,_std::allocator<glu::DataType>_> local_28;
  UniformCollection *local_10;
  UniformCollection *this_local;
  
  local_10 = this;
  getSamplerTypes(&local_28,this);
  sVar1 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size(&local_28);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector(&local_28);
  return 1 < sVar1;
}

Assistant:

bool containsSeveralSamplerTypes (void) const
	{
		return getSamplerTypes().size() > 1;
	}